

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64BaseInfo.h
# Opt level: O0

char * getCondCodeName(A64CC_CondCode CC)

{
  A64CC_CondCode CC_local;
  char *local_8;
  
  switch(CC) {
  case A64CC_EQ:
    local_8 = "eq";
    break;
  case A64CC_NE:
    local_8 = "ne";
    break;
  case A64CC_HS:
    local_8 = "hs";
    break;
  case A64CC_LO:
    local_8 = "lo";
    break;
  case A64CC_MI:
    local_8 = "mi";
    break;
  case A64CC_PL:
    local_8 = "pl";
    break;
  case A64CC_VS:
    local_8 = "vs";
    break;
  case A64CC_VC:
    local_8 = "vc";
    break;
  case A64CC_HI:
    local_8 = "hi";
    break;
  case A64CC_LS:
    local_8 = "ls";
    break;
  case A64CC_GE:
    local_8 = "ge";
    break;
  case A64CC_LT:
    local_8 = "lt";
    break;
  case A64CC_GT:
    local_8 = "gt";
    break;
  case A64CC_LE:
    local_8 = "le";
    break;
  case A64CC_AL:
    local_8 = "al";
    break;
  case A64CC_NV:
    local_8 = "nv";
    break;
  default:
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

inline static const char *getCondCodeName(A64CC_CondCode CC)
{
	switch (CC) {
		default: return NULL;	// never reach
		case A64CC_EQ:  return "eq";
		case A64CC_NE:  return "ne";
		case A64CC_HS:  return "hs";
		case A64CC_LO:  return "lo";
		case A64CC_MI:  return "mi";
		case A64CC_PL:  return "pl";
		case A64CC_VS:  return "vs";
		case A64CC_VC:  return "vc";
		case A64CC_HI:  return "hi";
		case A64CC_LS:  return "ls";
		case A64CC_GE:  return "ge";
		case A64CC_LT:  return "lt";
		case A64CC_GT:  return "gt";
		case A64CC_LE:  return "le";
		case A64CC_AL:  return "al";
		case A64CC_NV:  return "nv";
	}
}